

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void WriteVarLen(TArray<unsigned_char,_unsigned_char> *file,DWORD value)

{
  undefined8 in_RAX;
  char cVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uVar2 = value & 0x7f;
  while (0x7f < value) {
    value = value >> 7;
    uVar2 = value & 0xff | uVar2 << 8 | 0x80;
  }
  uVar3 = (ulong)uVar2;
  uStack_28 = in_RAX;
  do {
    cVar1 = (char)uVar2;
    uStack_28 = CONCAT17(cVar1,(undefined7)uStack_28);
    TArray<unsigned_char,_unsigned_char>::Push(file,(uchar *)((long)&uStack_28 + 7));
    uVar2 = (uint)(uVar3 >> 8);
    uVar3 = uVar3 >> 8;
  } while (cVar1 < '\0');
  return;
}

Assistant:

static void WriteVarLen (TArray<BYTE> &file, DWORD value)
{
   DWORD buffer = value & 0x7F;

   while ( (value >>= 7) )
   {
     buffer <<= 8;
     buffer |= (value & 0x7F) | 0x80;
   }

   for (;;)
   {
	   file.Push(BYTE(buffer));
	   if (buffer & 0x80)
	   {
		   buffer >>= 8;
	   }
	   else
	   {
		   break;
	   }
   }
}